

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetShaderDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderDesc *Desc)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetShaderTypeLiteralName(*(SHADER_TYPE *)(this + 8));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String GetShaderDescString(const ShaderDesc& Desc)
{
    String Str;
    Str += "Name: '";
    Str += Desc.Name != nullptr ? Desc.Name : "<NULL>";

    Str += "'; Type: ";
    Str += GetShaderTypeLiteralName(Desc.ShaderType);

    Str += "; combined samplers: ";
    Str += Desc.UseCombinedTextureSamplers ? '1' : '0';

    Str += "; sampler suffix: ";
    Str += Desc.CombinedSamplerSuffix != nullptr ? Desc.CombinedSamplerSuffix : "<NULL>";

    return Str;
}